

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O3

errr Term_mousepress(wchar_t x,wchar_t y,char button)

{
  undefined2 uVar1;
  term *ptVar2;
  uint16_t uVar3;
  
  Term->key_queue[Term->key_head].type = EVT_MOUSE;
  *(char *)((long)Term->key_queue + (ulong)Term->key_head * 0xc + 4) = (char)x;
  *(char *)((long)Term->key_queue + (ulong)Term->key_head * 0xc + 5) = (char)y;
  *(byte *)((long)Term->key_queue + (ulong)Term->key_head * 0xc + 6) = button & 0xf;
  *(byte *)((long)Term->key_queue + (ulong)Term->key_head * 0xc + 7) = (byte)button >> 4;
  ptVar2 = Term;
  uVar1 = Term->key_head;
  uVar3 = 0;
  if ((uint16_t)(uVar1 + 1) != Term->key_size) {
    uVar3 = uVar1 + 1;
  }
  Term->key_head = uVar3;
  return (uint)(uVar3 == ptVar2->key_tail);
}

Assistant:

errr Term_mousepress(int x, int y, char button)/*, uint8_t mods);*/
{
	/* Store the char, advance the queue */
	Term->key_queue[Term->key_head].type = EVT_MOUSE;
	Term->key_queue[Term->key_head].mouse.x = x;
	Term->key_queue[Term->key_head].mouse.y = y;
	/* XXX for now I encode the mods into the button number, so I would
	 * not have to worry about the other platforms, when all platforms set
	 * mods, this code should be replaced with :
	 * Term->key_queue[Term->key_head].mouse.button = button;
	 * Term->key_queue[Term->key_head].mouse.mods = mods;
	 */
	Term->key_queue[Term->key_head].mouse.button = (button & 0x0F);
	Term->key_queue[Term->key_head].mouse.mods = ((button & 0xF0)>>4);

	Term->key_head++;

	/* Circular queue, handle wrap */
	if (Term->key_head == Term->key_size) Term->key_head = 0;

	/* Success (unless overflow) */
	if (Term->key_head != Term->key_tail) return (0);
  
	/* Problem */
	return (1);
}